

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbox.hpp
# Opt level: O2

void __thiscall
so_5::abstract_message_box_t::deliver_message<so_5::stats::messages::quantity<unsigned_long>>
          (abstract_message_box_t *this,type_index subscription_type,
          unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
          *msg_unique_ptr,message_mutability_t mutability)

{
  quantity<unsigned_long> *pqVar1;
  atomic_refcounted_t *paVar2;
  _Head_base<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_false> local_28;
  type_index subscription_type_local;
  
  subscription_type_local = subscription_type;
  ensure_message_with_actual_data<so_5::stats::messages::quantity<unsigned_long>>
            ((msg_unique_ptr->_M_t).
             super___uniq_ptr_impl<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
             .super__Head_base<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_false>.
             _M_head_impl);
  pqVar1 = (msg_unique_ptr->_M_t).
           super___uniq_ptr_impl<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
           .super__Head_base<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_false>.
           _M_head_impl;
  (**(code **)((long)(pqVar1->super_message_t)._vptr_message_t + 0x20))(pqVar1,mutability);
  local_28._M_head_impl =
       (msg_unique_ptr->_M_t).
       super___uniq_ptr_impl<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
       .super__Head_base<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_false>._M_head_impl;
  (msg_unique_ptr->_M_t).
  super___uniq_ptr_impl<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
  .super__Head_base<0UL,_so_5::stats::messages::quantity<unsigned_long>_*,_false>._M_head_impl =
       (quantity<unsigned_long> *)0x0;
  if (local_28._M_head_impl != (quantity<unsigned_long> *)0x0) {
    LOCK();
    paVar2 = &((local_28._M_head_impl)->super_message_t).super_atomic_refcounted_t;
    (paVar2->m_ref_counter).super___atomic_base<unsigned_long> =
         (__atomic_base<unsigned_long>)
         ((__int_type)(paVar2->m_ref_counter).super___atomic_base<unsigned_long> + 1);
    UNLOCK();
  }
  (*this->_vptr_abstract_message_box_t[7])(this,&subscription_type_local,&local_28,1);
  intrusive_ptr_t<so_5::message_t>::~intrusive_ptr_t((intrusive_ptr_t<so_5::message_t> *)&local_28);
  return;
}

Assistant:

inline void
abstract_message_box_t::deliver_message(
	std::type_index subscription_type,
	std::unique_ptr< MESSAGE > msg_unique_ptr,
	message_mutability_t mutability ) const
{
	ensure_classical_message< MESSAGE >();
	ensure_message_with_actual_data( msg_unique_ptr.get() );

	change_message_mutability( *msg_unique_ptr, mutability );

	deliver_message(
		subscription_type,
		message_ref_t( msg_unique_ptr.release() ) );
}